

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuumEnergyAngle.test.cpp
# Opt level: O3

void verifyChunkWithLANG14(ContinuumEnergyAngle *chunk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *pdVar10;
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  *pIVar11;
  bool bVar12;
  uint uVar13;
  long lVar14;
  variant_alternative_t<3UL,_variant<LegendreCoefficients,_KalbachMann,_ThermalScatteringData,_TabulatedDistribution>_>
  *pvVar15;
  ulong uVar16;
  double *pdVar17;
  unsigned_long n;
  char *pcVar18;
  char *pcVar19;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  AssertionHandler catchAssertionHandler_57;
  TabulatedDistribution subsection2;
  TabulatedDistribution subsection1;
  undefined1 local_330 [8];
  undefined8 local_328;
  char *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [2];
  bool local_2f5;
  IResultCapture *local_2f0;
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  char *local_2c8;
  double dStack_2c0;
  undefined1 local_2b8 [16];
  IResultCapture *local_2a8;
  int local_2a0;
  undefined1 local_290 [8];
  undefined8 local_288;
  double *local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  undefined1 local_258 [9];
  bool bStack_24f;
  undefined6 uStack_24e;
  iterator_t<CRng> *local_248;
  WithinRelMatcher *local_240;
  long local_238;
  undefined1 local_230 [9];
  bool bStack_227;
  undefined6 uStack_226;
  iterator_t<CRng> *local_220;
  WithinRelMatcher *local_218;
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  *local_210;
  undefined1 local_208 [48];
  undefined1 local_1d8 [16];
  IResultCapture *local_1c8;
  int local_1c0;
  iterator_t<CRng> local_1b8;
  undefined1 *local_1b0;
  double local_1a8;
  iterator_t<CRng> local_1a0;
  undefined1 *local_198;
  iterator_t<CRng> local_190;
  undefined1 *local_188;
  iterator_t<CRng> local_180;
  undefined1 *local_178;
  iterator_t<CRng> local_170;
  undefined1 *local_168;
  iterator_t<CRng> local_160;
  undefined1 *local_158;
  iterator_t<CRng> local_150;
  undefined1 *local_148;
  iterator_t<CRng> local_140;
  undefined1 *local_138;
  iterator_t<CRng> local_130;
  undefined1 *local_128;
  iterator_t<CRng> local_120;
  undefined1 *local_118;
  iterator_t<CRng> local_110;
  undefined1 *local_108;
  iterator_t<CRng> local_100;
  undefined1 *local_f8;
  iterator_t<CRng> local_f0;
  undefined1 *local_e8;
  iterator_t<CRng> local_e0;
  undefined1 *local_d8;
  iterator_t<CRng> local_d0;
  undefined1 *local_c8;
  iterator_t<CRng> local_c0;
  undefined1 *local_b8;
  iterator_t<CRng> local_b0;
  undefined1 *local_a8;
  iterator_t<CRng> local_a0;
  undefined1 *local_98;
  iterator_t<CRng> local_90;
  undefined1 *local_88;
  iterator_t<CRng> local_80;
  undefined1 *local_78;
  iterator_t<CRng> local_70;
  undefined1 *local_68;
  iterator_t<CRng> local_60;
  undefined1 *local_58;
  iterator_t<CRng> local_50;
  undefined1 *local_48;
  iterator_t<CRng> local_40;
  undefined1 *local_38;
  
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x22a;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x10;
  capturedExpression.m_start = "1 == chunk.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName,(SourceLineInfo *)local_2e8,capturedExpression,
             ContinueOnFailure);
  uStack_2e0 = CONCAT62(uStack_2e0._2_6_,0x101);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  local_2c8 = (char *)CONCAT44(local_2c8._4_4_,1);
  local_210 = &chunk->data_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x22b;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x10;
  capturedExpression_00.m_start = "2 == chunk.LEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_00,(SourceLineInfo *)local_2e8,
             capturedExpression_00,ContinueOnFailure);
  iVar1 = (int)(chunk->data_).interpolation_.super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uStack_2e0._0_2_ = CONCAT11(iVar1 == 2,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  uStack_2e0 = CONCAT44(2,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  local_2c8 = (char *)CONCAT44(local_2c8._4_4_,iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x22c;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "2 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_01,(SourceLineInfo *)local_2e8,
             capturedExpression_01,ContinueOnFailure);
  local_2c8 = (char *)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
  uStack_2e0._0_2_ = CONCAT11(local_2c8 == (char *)0x2,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(2,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x22d;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x23;
  capturedExpression_02.m_start = "2 == chunk.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_02,(SourceLineInfo *)local_2e8,
             capturedExpression_02,ContinueOnFailure);
  local_2c8 = (char *)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
  uStack_2e0._0_2_ = CONCAT11(local_2c8 == (char *)0x2,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(2,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x22e;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0xf;
  capturedExpression_03.m_start = "1 == chunk.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_03,(SourceLineInfo *)local_2e8,
             capturedExpression_03,ContinueOnFailure);
  lVar14 = (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_2c8 = (char *)(lVar14 >> 3);
  uStack_2e0._0_2_ = CONCAT11(lVar14 == 8,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x22f;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x27;
  capturedExpression_04.m_start = "1 == chunk.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_04,(SourceLineInfo *)local_2e8,
             capturedExpression_04,ContinueOnFailure);
  lVar14 = (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_2c8 = (char *)(lVar14 >> 3);
  uStack_2e0._0_2_ = CONCAT11(lVar14 == 8,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x230;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x17;
  capturedExpression_05.m_start = "1 == chunk.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_05,(SourceLineInfo *)local_2e8,
             capturedExpression_05,ContinueOnFailure);
  lVar14 = (long)(chunk->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(chunk->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_2c8 = (char *)(lVar14 >> 3);
  uStack_2e0._0_2_ = CONCAT11(lVar14 == 8,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x231;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x17;
  capturedExpression_06.m_start = "1 == chunk.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_06,(SourceLineInfo *)local_2e8,
             capturedExpression_06,ContinueOnFailure);
  lVar14 = (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_2c8 = (char *)(lVar14 >> 3);
  uStack_2e0._0_2_ = CONCAT11(lVar14 == 8,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x232;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x13;
  capturedExpression_07.m_start = "1 == chunk.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_07,(SourceLineInfo *)local_2e8,
             capturedExpression_07,ContinueOnFailure);
  local_2c8 = (char *)*(chunk->data_).interpolation_.super_InterpolationBase.
                       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  uStack_2e0._0_2_ = CONCAT11(local_2c8 == (char *)0x1,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x233;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x13;
  capturedExpression_08.m_start = "2 == chunk.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_08,(SourceLineInfo *)local_2e8,
             capturedExpression_08,ContinueOnFailure);
  local_2c8 = (char *)*(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
  uStack_2e0._0_2_ = CONCAT11(local_2c8 == (char *)0x2,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(2,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x234;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x20;
  capturedExpression_09.m_start = "1 == chunk.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_09,(SourceLineInfo *)local_2e8,
             capturedExpression_09,ContinueOnFailure);
  lVar14 = (long)(chunk->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(chunk->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_2c8 = (char *)(lVar14 >> 3);
  uStack_2e0._0_2_ = CONCAT11(lVar14 == 8,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x235;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1e;
  capturedExpression_10.m_start = "1 == chunk.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_10,(SourceLineInfo *)local_2e8,
             capturedExpression_10,ContinueOnFailure);
  lVar14 = (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  local_2c8 = (char *)(lVar14 >> 3);
  uStack_2e0._0_2_ = CONCAT11(lVar14 == 8,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x236;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "1 == chunk.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_11,(SourceLineInfo *)local_2e8,
             capturedExpression_11,ContinueOnFailure);
  local_2c8 = (char *)*(chunk->data_).interpolation_.super_InterpolationBase.
                       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  uStack_2e0._0_2_ = CONCAT11(local_2c8 == (char *)0x1,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(1,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  local_2e8 = (undefined1  [8])0x1af5a4;
  uStack_2e0 = 0x237;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x1a;
  capturedExpression_12.m_start = "2 == chunk.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,macroName_12,(SourceLineInfo *)local_2e8,
             capturedExpression_12,ContinueOnFailure);
  local_2c8 = (char *)*(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
  uStack_2e0._0_2_ = CONCAT11(local_2c8 == (char *)0x2,true);
  local_2e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  uStack_2e0 = CONCAT44(2,(undefined4)uStack_2e0);
  local_2d8 = "==";
  sStack_2d0 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,(ITransientExpression *)local_2e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  if (local_1d8[0xb] == false) {
    (*local_1c8->_vptr_IResultCapture[0x13])();
  }
  pvVar15 = std::
            get<3ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                      ((chunk->data_).sequence_.
                       super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  local_208._0_8_ =
       *(undefined8 *)
        &(pvVar15->super_Base).super_ListRecord.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>;
  local_208._8_8_ =
       (pvVar15->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_208._16_8_ =
       (pvVar15->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_208._24_8_ =
       (pvVar15->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_208._32_8_ =
       (pvVar15->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_208._40_8_ =
       (pvVar15->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1d8,
             &(pvVar15->super_Base).super_ListRecord.data);
  local_1c0 = pvVar15->lang_;
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x23c;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x22;
  capturedExpression_13.m_start = "1e-5, WithinRel( subsection1.E() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_13,(SourceLineInfo *)local_330,
             capturedExpression_13,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,(double)local_208._32_8_);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x23d;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x2f;
  capturedExpression_14.m_start = "1e-5, WithinRel( subsection1.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_14,(SourceLineInfo *)local_330,
             capturedExpression_14,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,(double)local_208._32_8_);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x23e;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x18;
  capturedExpression_15.m_start = "14 == subsection1.LANG()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_15,(SourceLineInfo *)local_330,
             capturedExpression_15,ContinueOnFailure);
  local_328._1_1_ = local_1c0 == 0xe;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_328._4_4_ = 0xe;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_4_ = local_1c0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x23f;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "14 == subsection1.representation()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_16,(SourceLineInfo *)local_330,
             capturedExpression_16,ContinueOnFailure);
  local_328._1_1_ = local_1c0 == 0xe;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_328._4_4_ = 0xe;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_4_ = local_1c0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x240;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x15;
  capturedExpression_17.m_start = "0 == subsection1.ND()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_17,(SourceLineInfo *)local_330,
             capturedExpression_17,ContinueOnFailure);
  local_328._1_1_ = local_208._24_8_ == 0;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328 = local_328 & 0xffffffff;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_8_ = local_208._24_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x241;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x29;
  capturedExpression_18.m_start = "0 == subsection1.numberDiscreteEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_18,(SourceLineInfo *)local_330,
             capturedExpression_18,ContinueOnFailure);
  local_328._1_1_ = local_208._24_8_ == 0;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328 = local_328 & 0xffffffff;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_8_ = local_208._24_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x242;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x15;
  capturedExpression_19.m_start = "4 == subsection1.NA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_19,(SourceLineInfo *)local_330,
             capturedExpression_19,ContinueOnFailure);
  local_328._1_1_ = (char *)local_208._16_8_ == (char *)0x4;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328._4_4_ = 4;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_8_ = local_208._16_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x243;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x2a;
  capturedExpression_20.m_start = "4 == subsection1.numberAngularParameters()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_20,(SourceLineInfo *)local_330,
             capturedExpression_20,ContinueOnFailure);
  local_328._1_1_ = (char *)local_208._16_8_ == (char *)0x4;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328._4_4_ = 4;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_8_ = local_208._16_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x244;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x16;
  capturedExpression_21.m_start = "12 == subsection1.NW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_21,(SourceLineInfo *)local_330,
             capturedExpression_21,ContinueOnFailure);
  lVar14 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_;
  local_318[0]._8_8_ = lVar14 >> 3;
  local_328._1_1_ = lVar14 == 0x60;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328._4_4_ = 0xc;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x245;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x16;
  capturedExpression_22.m_start = "2 == subsection1.NEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_22,(SourceLineInfo *)local_330,
             capturedExpression_22,ContinueOnFailure);
  local_328._1_1_ = (char *)local_208._0_8_ == (char *)0x2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_8_ = local_208._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x246;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x2a;
  capturedExpression_23.m_start = "2 == subsection1.numberSecondaryEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_23,(SourceLineInfo *)local_330,
             capturedExpression_23,ContinueOnFailure);
  local_328._1_1_ = (char *)local_208._0_8_ == (char *)0x2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  local_318[0]._8_8_ = local_208._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x247;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x1c;
  capturedExpression_24.m_start = "2 == subsection1.EP().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_24,(SourceLineInfo *)local_330,
             capturedExpression_24,ContinueOnFailure);
  local_318[0]._8_8_ =
       (ulong)(local_208._16_8_ +
              (CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3) + 1) /
       (ulong)(local_208._16_8_ + 2);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x248;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x22;
  capturedExpression_25.m_start = "2 == subsection1.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_25,(SourceLineInfo *)local_330,
             capturedExpression_25,ContinueOnFailure);
  local_318[0]._8_8_ =
       (ulong)(local_208._16_8_ +
              (CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3) + 1) /
       (ulong)(local_208._16_8_ + 2);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x249;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x24;
  capturedExpression_26.m_start = "1., WithinRel( subsection1.EP()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_26,(SourceLineInfo *)local_330,
             capturedExpression_26,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*(double *)local_1d8._0_8_);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x24a;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x24;
  capturedExpression_27.m_start = "7., WithinRel( subsection1.EP()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_27,(SourceLineInfo *)local_330,
             capturedExpression_27,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x401c000000000000;
  local_248 = (iterator_t<CRng> *)(local_208._16_8_ + 2);
  local_198 = local_258;
  lVar14 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_;
  auVar2._8_8_ = lVar14 >> 0x3f;
  auVar2._0_8_ = lVar14 >> 3;
  lVar14 = SUB168(auVar2 % SEXT816((long)local_248),0);
  local_240 = (WithinRelMatcher *)((long)local_248 - lVar14);
  if (lVar14 == 0) {
    local_240 = (WithinRelMatcher *)0x0;
  }
  local_1a0._M_current = (double *)local_1d8._0_8_;
  unique0x10008085 = (vector<double,_std::allocator<double>_> *)local_1d8;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_198,&local_1a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_1a0._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_230;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x24b;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x2a;
  capturedExpression_28.m_start = "1., WithinRel( subsection1.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_28,(SourceLineInfo *)local_330,
             capturedExpression_28,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*(double *)local_1d8._0_8_);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x24c;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x2a;
  capturedExpression_29.m_start = "7., WithinRel( subsection1.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_29,(SourceLineInfo *)local_330,
             capturedExpression_29,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x401c000000000000;
  local_248 = (iterator_t<CRng> *)(local_208._16_8_ + 2);
  lVar14 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_;
  auVar3._8_8_ = lVar14 >> 0x3f;
  auVar3._0_8_ = lVar14 >> 3;
  lVar14 = SUB168(auVar3 % SEXT816((long)local_248),0);
  local_240 = (WithinRelMatcher *)((long)local_248 - lVar14);
  if (lVar14 == 0) {
    local_240 = (WithinRelMatcher *)0x0;
  }
  local_190._M_current = (double *)local_1d8._0_8_;
  local_188 = local_258;
  unique0x1000808d = (vector<double,_std::allocator<double>_> *)local_1d8;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_188,&local_190,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_190._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_230;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x24d;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x1c;
  capturedExpression_30.m_start = "2 == subsection1.F0().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_30,(SourceLineInfo *)local_330,
             capturedExpression_30,ContinueOnFailure);
  local_318[0]._8_8_ =
       (ulong)(local_208._16_8_ +
              ((CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_208._16_8_ + 2);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x24e;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x34;
  capturedExpression_31.m_start = "2 == subsection1.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_31,(SourceLineInfo *)local_330,
             capturedExpression_31,ContinueOnFailure);
  local_318[0]._8_8_ =
       (ulong)(local_208._16_8_ +
              ((CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_208._16_8_ + 2);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x24f;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x24;
  capturedExpression_32.m_start = "2., WithinRel( subsection1.F0()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_32,(SourceLineInfo *)local_330,
             capturedExpression_32,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*(double *)(local_1d8._0_8_ + 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x250;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x24;
  capturedExpression_33.m_start = "8., WithinRel( subsection1.F0()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_33,(SourceLineInfo *)local_330,
             capturedExpression_33,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4020000000000000;
  local_280 = (double *)(local_1d8._0_8_ + 8);
  local_288 = (pointer)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  local_278[0]._0_8_ = local_208._16_8_ + 2;
  auVar4._8_8_ = (long)local_288 - (long)local_280 >> 0x3f;
  auVar4._0_8_ = (long)local_288 - (long)local_280 >> 3;
  lVar14 = SUB168(auVar4 % SEXT816((long)local_278[0]._0_8_),0);
  local_278[0]._8_8_ = local_278[0]._0_8_ - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_180._M_current = local_280;
  local_178 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_178,&local_180,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_180._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x251;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x3c;
  capturedExpression_34.m_start = "2., WithinRel( subsection1.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_34,(SourceLineInfo *)local_330,
             capturedExpression_34,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*(double *)(local_1d8._0_8_ + 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x252;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x3c;
  capturedExpression_35.m_start = "8., WithinRel( subsection1.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_35,(SourceLineInfo *)local_330,
             capturedExpression_35,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4020000000000000;
  local_280 = (double *)(local_1d8._0_8_ + 8);
  local_288 = (pointer)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  local_278[0]._0_8_ = local_208._16_8_ + 2;
  auVar5._8_8_ = (long)local_288 - (long)local_280 >> 0x3f;
  auVar5._0_8_ = (long)local_288 - (long)local_280 >> 3;
  lVar14 = SUB168(auVar5 % SEXT816((long)local_278[0]._0_8_),0);
  local_278[0]._8_8_ = local_278[0]._0_8_ - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_170._M_current = local_280;
  local_168 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_168,&local_170,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_170._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x253;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x1c;
  capturedExpression_36.m_start = "2 == subsection1.MU().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_36,(SourceLineInfo *)local_330,
             capturedExpression_36,ContinueOnFailure);
  uVar16 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3;
  local_318[0]._8_8_ =
       (uVar16 / (ulong)(local_208._16_8_ + 2) + 1) -
       (ulong)(uVar16 % (ulong)(local_208._16_8_ + 2) == 0);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x254;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x21;
  capturedExpression_37.m_start = "2 == subsection1.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_37,(SourceLineInfo *)local_330,
             capturedExpression_37,ContinueOnFailure);
  uVar16 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3;
  local_318[0]._8_8_ =
       (uVar16 / (ulong)(local_208._16_8_ + 2) + 1) -
       (ulong)(uVar16 % (ulong)(local_208._16_8_ + 2) == 0);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x255;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x27;
  capturedExpression_38.m_start = "3., WithinRel( subsection1.MU()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_38,(SourceLineInfo *)local_330,
             capturedExpression_38,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x4008000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  uVar13 = 2;
  if (pcVar18 < (char *)0x2) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_330,*(double *)(local_1d8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x256;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x27;
  capturedExpression_39.m_start = "5., WithinRel( subsection1.MU()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_39,(SourceLineInfo *)local_330,
             capturedExpression_39,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4014000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  pcVar19 = (char *)0x2;
  if (pcVar18 < (char *)0x2) {
    pcVar19 = pcVar18;
  }
  local_280 = (double *)(local_1d8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  local_288 = (pointer)(local_1d8._0_8_ + pcVar18 * 8);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_160._M_current = local_280;
  local_158 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_158,&local_160,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_160._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x257;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x27;
  capturedExpression_40.m_start = "9., WithinRel( subsection1.MU()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_40,(SourceLineInfo *)local_330,
             capturedExpression_40,ContinueOnFailure);
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_258._0_8_ = (_func_int **)0x4022000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 2;
  if (pcVar19 < (char *)0x2) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x258;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x28;
  capturedExpression_41.m_start = "11., WithinRel( subsection1.MU()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_41,(SourceLineInfo *)local_330,
             capturedExpression_41,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4026000000000000;
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x2;
  if (pcVar19 < (char *)0x2) {
    pcVar18 = pcVar19;
  }
  local_280 = pdVar17 + ((ulong)pcVar18 & 0xffffffff);
  local_288 = (pointer)(pdVar17 + (long)pcVar19);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_150._M_current = local_280;
  local_148 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_148,&local_150,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_150._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x259;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x2c;
  capturedExpression_42.m_start = "3., WithinRel( subsection1.cosines()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_42,(SourceLineInfo *)local_330,
             capturedExpression_42,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x4008000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  uVar13 = 2;
  if (pcVar18 < (char *)0x2) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_330,*(double *)(local_1d8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x25a;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x2c;
  capturedExpression_43.m_start = "5., WithinRel( subsection1.cosines()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_43,(SourceLineInfo *)local_330,
             capturedExpression_43,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4014000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  pcVar19 = (char *)0x2;
  if (pcVar18 < (char *)0x2) {
    pcVar19 = pcVar18;
  }
  local_280 = (double *)(local_1d8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  local_288 = (pointer)(local_1d8._0_8_ + pcVar18 * 8);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_140._M_current = local_280;
  local_138 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_138,&local_140,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_140._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x25b;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x2c;
  capturedExpression_44.m_start = "9., WithinRel( subsection1.cosines()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_44,(SourceLineInfo *)local_330,
             capturedExpression_44,ContinueOnFailure);
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_258._0_8_ = (_func_int **)0x4022000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 2;
  if (pcVar19 < (char *)0x2) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x25c;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x2d;
  capturedExpression_45.m_start = "11., WithinRel( subsection1.cosines()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_45,(SourceLineInfo *)local_330,
             capturedExpression_45,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4026000000000000;
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x2;
  if (pcVar19 < (char *)0x2) {
    pcVar18 = pcVar19;
  }
  local_280 = pdVar17 + ((ulong)pcVar18 & 0xffffffff);
  local_288 = (pointer)(pdVar17 + (long)pcVar19);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_130._M_current = local_280;
  local_128 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_128,&local_130,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_130._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x25d;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x1b;
  capturedExpression_46.m_start = "2 == subsection1.F().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_46,(SourceLineInfo *)local_330,
             capturedExpression_46,ContinueOnFailure);
  uVar16 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3;
  local_318[0]._8_8_ =
       (uVar16 / (ulong)(local_208._16_8_ + 2) + 1) -
       (ulong)(uVar16 % (ulong)(local_208._16_8_ + 2) == 0);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x25e;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x27;
  capturedExpression_47.m_start = "2 == subsection1.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_47,(SourceLineInfo *)local_330,
             capturedExpression_47,ContinueOnFailure);
  uVar16 = CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3;
  local_318[0]._8_8_ =
       (uVar16 / (ulong)(local_208._16_8_ + 2) + 1) -
       (ulong)(uVar16 % (ulong)(local_208._16_8_ + 2) == 0);
  local_328._1_1_ = local_318[0]._8_8_ == 2;
  local_328._0_1_ = true;
  local_330 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_328._4_4_ = 2;
  local_320 = "==";
  local_318[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_330);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x25f;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x26;
  capturedExpression_48.m_start = "4., WithinRel( subsection1.F()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_48,(SourceLineInfo *)local_330,
             capturedExpression_48,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x4010000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  uVar13 = 3;
  if (pcVar18 < (char *)0x3) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_330,*(double *)(local_1d8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x260;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x26;
  capturedExpression_49.m_start = "6., WithinRel( subsection1.F()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_49,(SourceLineInfo *)local_330,
             capturedExpression_49,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4018000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  pcVar19 = (char *)0x3;
  if (pcVar18 < (char *)0x3) {
    pcVar19 = pcVar18;
  }
  local_280 = (double *)(local_1d8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  local_288 = (pointer)(local_1d8._0_8_ + pcVar18 * 8);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_120._M_current = local_280;
  local_118 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_118,&local_120,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_120._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x261;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x27;
  capturedExpression_50.m_start = "10., WithinRel( subsection1.F()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_50,(SourceLineInfo *)local_330,
             capturedExpression_50,ContinueOnFailure);
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_258._0_8_ = (_func_int **)0x4024000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 3;
  if (pcVar19 < (char *)0x3) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x262;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x27;
  capturedExpression_51.m_start = "12., WithinRel( subsection1.F()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_51,(SourceLineInfo *)local_330,
             capturedExpression_51,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4028000000000000;
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x3;
  if (pcVar19 < (char *)0x3) {
    pcVar18 = pcVar19;
  }
  local_280 = pdVar17 + ((ulong)pcVar18 & 0xffffffff);
  local_288 = (pointer)(pdVar17 + (long)pcVar19);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_110._M_current = local_280;
  local_108 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_108,&local_110,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_110._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x263;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x32;
  capturedExpression_52.m_start = "4., WithinRel( subsection1.probabilities()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_52,(SourceLineInfo *)local_330,
             capturedExpression_52,ContinueOnFailure);
  local_258._0_8_ = (_func_int **)0x4010000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  uVar13 = 3;
  if (pcVar18 < (char *)0x3) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_330,*(double *)(local_1d8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x264;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x32;
  capturedExpression_53.m_start = "6., WithinRel( subsection1.probabilities()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_53,(SourceLineInfo *)local_330,
             capturedExpression_53,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4018000000000000;
  pcVar18 = (char *)(CONCAT44(local_1d8._12_4_,local_1d8._8_4_) - local_1d8._0_8_ >> 3);
  if ((char *)(local_208._16_8_ + 2) < pcVar18) {
    pcVar18 = (char *)(local_208._16_8_ + 2);
  }
  pcVar19 = (char *)0x3;
  if (pcVar18 < (char *)0x3) {
    pcVar19 = pcVar18;
  }
  local_280 = (double *)(local_1d8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  local_288 = (pointer)(local_1d8._0_8_ + pcVar18 * 8);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_100._M_current = local_280;
  local_f8 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_f8,&local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_100._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x265;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x33;
  capturedExpression_54.m_start = "10., WithinRel( subsection1.probabilities()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_54,(SourceLineInfo *)local_330,
             capturedExpression_54,ContinueOnFailure);
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_258._0_8_ = (_func_int **)0x4024000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 3;
  if (pcVar19 < (char *)0x3) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_258);
  local_288._1_1_ = bVar12;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_280 = (double *)local_258;
  local_278[0]._0_8_ = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  local_330 = (undefined1  [8])0x1af5a4;
  local_328 = (pointer)0x266;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x33;
  capturedExpression_55.m_start = "12., WithinRel( subsection1.probabilities()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2e8,macroName_55,(SourceLineInfo *)local_330,
             capturedExpression_55,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4028000000000000;
  pcVar18 = (char *)(local_208._16_8_ + 2);
  pdVar10 = (double *)CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
  pdVar17 = (double *)(local_1d8._0_8_ + (char *)(local_208._16_8_ + 2) * 8);
  if ((char *)((long)pdVar10 - local_1d8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x3;
  if (pcVar19 < (char *)0x3) {
    pcVar18 = pcVar19;
  }
  local_280 = pdVar17 + ((ulong)pcVar18 & 0xffffffff);
  local_288 = (pointer)(pdVar17 + (long)pcVar19);
  local_278[0]._M_allocated_capacity = 2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_278[0]._8_8_ = 2 - lVar14;
  if (lVar14 == 0) {
    local_278[0]._8_8_ = 0;
  }
  local_f0._M_current = local_280;
  local_e8 = local_290;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_e8,&local_f0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_330,*local_f0._M_current);
  pIVar11 = local_210;
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_330,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_330;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2e8,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_330);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2e8);
  if (local_2b8[0xb] == false) {
    (*local_2a8->_vptr_IResultCapture[0x13])();
  }
  pvVar15 = std::
            get<3ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                      ((pIVar11->sequence_).
                       super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  local_2e8 = *(undefined1 (*) [8])
               &(pvVar15->super_Base).super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>;
  uStack_2e0 = (pvVar15->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Head_base<4UL,_long,_false>._M_head_impl;
  local_2d8 = (char *)(pvVar15->super_Base).super_ListRecord.metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                      _M_head_impl;
  sStack_2d0 = (pvVar15->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_2c8 = (char *)(pvVar15->super_Base).super_ListRecord.metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Head_base<1UL,_double,_false>._M_head_impl;
  dStack_2c0 = (pvVar15->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_2b8,
             &(pvVar15->super_Base).super_ListRecord.data);
  local_2a0 = pvVar15->lang_;
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x269;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x22;
  capturedExpression_56.m_start = "2e+7, WithinRel( subsection2.E() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_56,(SourceLineInfo *)local_290,
             capturedExpression_56,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,(double)local_2c8);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x26a;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x2f;
  capturedExpression_57.m_start = "2e+7, WithinRel( subsection2.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_57,(SourceLineInfo *)local_290,
             capturedExpression_57,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,(double)local_2c8);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x26b;
  macroName_58.m_size = 5;
  macroName_58.m_start = "CHECK";
  capturedExpression_58.m_size = 0x18;
  capturedExpression_58.m_start = "14 == subsection2.LANG()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_58,(SourceLineInfo *)local_290,
             capturedExpression_58,ContinueOnFailure);
  local_288._1_1_ = local_2a0 == 0xe;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_288._4_4_ = 0xe;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_4_ = local_2a0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x26c;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x15;
  capturedExpression_59.m_start = "0 == subsection2.ND()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_59,(SourceLineInfo *)local_290,
             capturedExpression_59,ContinueOnFailure);
  local_288._1_1_ = sStack_2d0 == 0;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288 = local_288 & 0xffffffff;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_8_ = sStack_2d0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x26d;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x29;
  capturedExpression_60.m_start = "0 == subsection2.numberDiscreteEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_60,(SourceLineInfo *)local_290,
             capturedExpression_60,ContinueOnFailure);
  local_288._1_1_ = sStack_2d0 == 0;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288 = local_288 & 0xffffffff;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_8_ = sStack_2d0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x26e;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x15;
  capturedExpression_61.m_start = "4 == subsection2.NA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_61,(SourceLineInfo *)local_290,
             capturedExpression_61,ContinueOnFailure);
  local_288._1_1_ = local_2d8 == (char *)0x4;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288._4_4_ = 4;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_8_ = local_2d8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x26f;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x2a;
  capturedExpression_62.m_start = "4 == subsection2.numberAngularParameters()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_62,(SourceLineInfo *)local_290,
             capturedExpression_62,ContinueOnFailure);
  local_288._1_1_ = local_2d8 == (char *)0x4;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288._4_4_ = 4;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_8_ = local_2d8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x270;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x16;
  capturedExpression_63.m_start = "12 == subsection2.NW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_63,(SourceLineInfo *)local_290,
             capturedExpression_63,ContinueOnFailure);
  lVar14 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_;
  local_278[0]._8_8_ = lVar14 >> 3;
  local_288._1_1_ = lVar14 == 0x60;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288._4_4_ = 0xc;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x271;
  macroName_64.m_size = 5;
  macroName_64.m_start = "CHECK";
  capturedExpression_64.m_size = 0x16;
  capturedExpression_64.m_start = "2 == subsection2.NEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_64,(SourceLineInfo *)local_290,
             capturedExpression_64,ContinueOnFailure);
  local_288._1_1_ = local_2e8 == (undefined1  [8])0x2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_8_ = local_2e8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x272;
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  capturedExpression_65.m_size = 0x2a;
  capturedExpression_65.m_start = "2 == subsection2.numberSecondaryEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_65,(SourceLineInfo *)local_290,
             capturedExpression_65,ContinueOnFailure);
  local_288._1_1_ = local_2e8 == (undefined1  [8])0x2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  local_278[0]._8_8_ = local_2e8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x273;
  macroName_66.m_size = 5;
  macroName_66.m_start = "CHECK";
  capturedExpression_66.m_size = 0x1c;
  capturedExpression_66.m_start = "2 == subsection2.EP().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_66,(SourceLineInfo *)local_290,
             capturedExpression_66,ContinueOnFailure);
  local_278[0]._8_8_ =
       (ulong)(local_2d8 + (CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3) + 1)
       / (ulong)(local_2d8 + 2);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x274;
  macroName_67.m_size = 5;
  macroName_67.m_start = "CHECK";
  capturedExpression_67.m_size = 0x22;
  capturedExpression_67.m_start = "2 == subsection2.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_67,(SourceLineInfo *)local_290,
             capturedExpression_67,ContinueOnFailure);
  local_278[0]._8_8_ =
       (ulong)(local_2d8 + (CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3) + 1)
       / (ulong)(local_2d8 + 2);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x275;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x25;
  capturedExpression_68.m_start = "13., WithinRel( subsection2.EP()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_68,(SourceLineInfo *)local_290,
             capturedExpression_68,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x402a000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*(double *)local_2b8._0_8_);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x276;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x25;
  capturedExpression_69.m_start = "19., WithinRel( subsection2.EP()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_69,(SourceLineInfo *)local_290,
             capturedExpression_69,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4033000000000000;
  local_220 = (iterator_t<CRng> *)(local_2d8 + 2);
  unique0x00005300 = local_2b8;
  lVar14 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_;
  auVar6._8_8_ = lVar14 >> 0x3f;
  auVar6._0_8_ = lVar14 >> 3;
  lVar14 = SUB168(auVar6 % SEXT816((long)local_220),0);
  local_218 = (WithinRelMatcher *)((long)local_220 - lVar14);
  if (lVar14 == 0) {
    local_218 = (WithinRelMatcher *)0x0;
  }
  local_e0._M_current = (double *)local_2b8._0_8_;
  local_d8 = local_230;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_d8,&local_e0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_e0._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = &local_1b8;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x277;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x2b;
  capturedExpression_70.m_start = "13., WithinRel( subsection2.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_70,(SourceLineInfo *)local_290,
             capturedExpression_70,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x402a000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*(double *)local_2b8._0_8_);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x278;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x2b;
  capturedExpression_71.m_start = "19., WithinRel( subsection2.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_71,(SourceLineInfo *)local_290,
             capturedExpression_71,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4033000000000000;
  local_220 = (iterator_t<CRng> *)(local_2d8 + 2);
  unique0x00005300 = local_2b8;
  lVar14 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_;
  auVar7._8_8_ = lVar14 >> 0x3f;
  auVar7._0_8_ = lVar14 >> 3;
  lVar14 = SUB168(auVar7 % SEXT816((long)local_220),0);
  local_218 = (WithinRelMatcher *)((long)local_220 - lVar14);
  if (lVar14 == 0) {
    local_218 = (WithinRelMatcher *)0x0;
  }
  local_d0._M_current = (double *)local_2b8._0_8_;
  local_c8 = local_230;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_c8,&local_d0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_d0._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = &local_1b8;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x279;
  macroName_72.m_size = 5;
  macroName_72.m_start = "CHECK";
  capturedExpression_72.m_size = 0x1c;
  capturedExpression_72.m_start = "2 == subsection2.F0().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_72,(SourceLineInfo *)local_290,
             capturedExpression_72,ContinueOnFailure);
  local_278[0]._8_8_ =
       (ulong)(local_2d8 +
              ((CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_2d8 + 2);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x27a;
  macroName_73.m_size = 5;
  macroName_73.m_start = "CHECK";
  capturedExpression_73.m_size = 0x34;
  capturedExpression_73.m_start = "2 == subsection2.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_73,(SourceLineInfo *)local_290,
             capturedExpression_73,ContinueOnFailure);
  local_278[0]._8_8_ =
       (ulong)(local_2d8 +
              ((CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_2d8 + 2);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x27b;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x25;
  capturedExpression_74.m_start = "14., WithinRel( subsection2.F0()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_74,(SourceLineInfo *)local_290,
             capturedExpression_74,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x402c000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*(double *)(local_2b8._0_8_ + 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x27c;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x25;
  capturedExpression_75.m_start = "20., WithinRel( subsection2.F0()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_75,(SourceLineInfo *)local_290,
             capturedExpression_75,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4034000000000000;
  local_248 = (iterator_t<CRng> *)(local_2b8._0_8_ + 8);
  unique0x10003f4f =
       (vector<double,_std::allocator<double>_> *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  local_240 = (WithinRelMatcher *)(local_2d8 + 2);
  auVar8._8_8_ = (long)unique0x10003f4f - (long)local_248 >> 0x3f;
  auVar8._0_8_ = (long)unique0x10003f4f - (long)local_248 >> 3;
  lVar14 = SUB168(auVar8 % SEXT816((long)local_240),0);
  local_238 = (long)local_240 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_b8 = local_258;
  local_c0._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_b8,&local_c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_c0._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x27d;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x3d;
  capturedExpression_76.m_start = "14., WithinRel( subsection2.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_76,(SourceLineInfo *)local_290,
             capturedExpression_76,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x402c000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*(double *)(local_2b8._0_8_ + 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x27e;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x3d;
  capturedExpression_77.m_start = "20., WithinRel( subsection2.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_77,(SourceLineInfo *)local_290,
             capturedExpression_77,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4034000000000000;
  local_248 = (iterator_t<CRng> *)(local_2b8._0_8_ + 8);
  unique0x10003f57 =
       (vector<double,_std::allocator<double>_> *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  local_240 = (WithinRelMatcher *)(local_2d8 + 2);
  auVar9._8_8_ = (long)unique0x10003f57 - (long)local_248 >> 0x3f;
  auVar9._0_8_ = (long)unique0x10003f57 - (long)local_248 >> 3;
  lVar14 = SUB168(auVar9 % SEXT816((long)local_240),0);
  local_238 = (long)local_240 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_a8 = local_258;
  local_b0._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_a8,&local_b0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_b0._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x27f;
  macroName_78.m_size = 5;
  macroName_78.m_start = "CHECK";
  capturedExpression_78.m_size = 0x1c;
  capturedExpression_78.m_start = "2 == subsection2.MU().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_78,(SourceLineInfo *)local_290,
             capturedExpression_78,ContinueOnFailure);
  uVar16 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3;
  local_278[0]._8_8_ =
       (uVar16 / (ulong)(local_2d8 + 2) + 1) - (ulong)(uVar16 % (ulong)(local_2d8 + 2) == 0);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x280;
  macroName_79.m_size = 5;
  macroName_79.m_start = "CHECK";
  capturedExpression_79.m_size = 0x21;
  capturedExpression_79.m_start = "2 == subsection2.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_79,(SourceLineInfo *)local_290,
             capturedExpression_79,ContinueOnFailure);
  uVar16 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3;
  local_278[0]._8_8_ =
       (uVar16 / (ulong)(local_2d8 + 2) + 1) - (ulong)(uVar16 % (ulong)(local_2d8 + 2) == 0);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x281;
  macroName_80.m_size = 10;
  macroName_80.m_start = "CHECK_THAT";
  capturedExpression_80.m_size = 0x28;
  capturedExpression_80.m_start = "15., WithinRel( subsection2.MU()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_80,(SourceLineInfo *)local_290,
             capturedExpression_80,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x402e000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  uVar13 = 2;
  if (pcVar18 < (char *)0x2) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_290,*(double *)(local_2b8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x282;
  macroName_81.m_size = 10;
  macroName_81.m_start = "CHECK_THAT";
  capturedExpression_81.m_size = 0x28;
  capturedExpression_81.m_start = "17., WithinRel( subsection2.MU()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_81,(SourceLineInfo *)local_290,
             capturedExpression_81,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4031000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  pcVar19 = (char *)0x2;
  if (pcVar18 < (char *)0x2) {
    pcVar19 = pcVar18;
  }
  local_248 = (iterator_t<CRng> *)(local_2b8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(local_2b8._0_8_ + pcVar18 * 8);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_98 = local_258;
  local_a0._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_98,&local_a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_a0._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x283;
  macroName_82.m_size = 10;
  macroName_82.m_start = "CHECK_THAT";
  capturedExpression_82.m_size = 0x28;
  capturedExpression_82.m_start = "21., WithinRel( subsection2.MU()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_82,(SourceLineInfo *)local_290,
             capturedExpression_82,ContinueOnFailure);
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_230._0_8_ = (_func_int **)0x4035000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 2;
  if (pcVar19 < (char *)0x2) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x284;
  macroName_83.m_size = 10;
  macroName_83.m_start = "CHECK_THAT";
  capturedExpression_83.m_size = 0x28;
  capturedExpression_83.m_start = "23., WithinRel( subsection2.MU()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_83,(SourceLineInfo *)local_290,
             capturedExpression_83,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4037000000000000;
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x2;
  if (pcVar19 < (char *)0x2) {
    pcVar18 = pcVar19;
  }
  local_248 = (iterator_t<CRng> *)(pdVar17 + ((ulong)pcVar18 & 0xffffffff));
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(pdVar17 + (long)pcVar19);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_88 = local_258;
  local_90._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_88,&local_90,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_90._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x285;
  macroName_84.m_size = 10;
  macroName_84.m_start = "CHECK_THAT";
  capturedExpression_84.m_size = 0x2d;
  capturedExpression_84.m_start = "15., WithinRel( subsection2.cosines()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_84,(SourceLineInfo *)local_290,
             capturedExpression_84,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x402e000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  uVar13 = 2;
  if (pcVar18 < (char *)0x2) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_290,*(double *)(local_2b8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x286;
  macroName_85.m_size = 10;
  macroName_85.m_start = "CHECK_THAT";
  capturedExpression_85.m_size = 0x2d;
  capturedExpression_85.m_start = "17., WithinRel( subsection2.cosines()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_85,(SourceLineInfo *)local_290,
             capturedExpression_85,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4031000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  pcVar19 = (char *)0x2;
  if (pcVar18 < (char *)0x2) {
    pcVar19 = pcVar18;
  }
  local_248 = (iterator_t<CRng> *)(local_2b8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(local_2b8._0_8_ + pcVar18 * 8);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_78 = local_258;
  local_80._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_78,&local_80,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_80._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x287;
  macroName_86.m_size = 10;
  macroName_86.m_start = "CHECK_THAT";
  capturedExpression_86.m_size = 0x2d;
  capturedExpression_86.m_start = "21., WithinRel( subsection2.cosines()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_86,(SourceLineInfo *)local_290,
             capturedExpression_86,ContinueOnFailure);
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_230._0_8_ = (_func_int **)0x4035000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 2;
  if (pcVar19 < (char *)0x2) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x288;
  macroName_87.m_size = 10;
  macroName_87.m_start = "CHECK_THAT";
  capturedExpression_87.m_size = 0x2d;
  capturedExpression_87.m_start = "23., WithinRel( subsection2.cosines()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_87,(SourceLineInfo *)local_290,
             capturedExpression_87,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4037000000000000;
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x2;
  if (pcVar19 < (char *)0x2) {
    pcVar18 = pcVar19;
  }
  local_248 = (iterator_t<CRng> *)(pdVar17 + ((ulong)pcVar18 & 0xffffffff));
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(pdVar17 + (long)pcVar19);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_68 = local_258;
  local_70._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_68,&local_70,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_70._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x289;
  macroName_88.m_size = 5;
  macroName_88.m_start = "CHECK";
  capturedExpression_88.m_size = 0x1b;
  capturedExpression_88.m_start = "2 == subsection2.F().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_88,(SourceLineInfo *)local_290,
             capturedExpression_88,ContinueOnFailure);
  uVar16 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3;
  local_278[0]._8_8_ =
       (uVar16 / (ulong)(local_2d8 + 2) + 1) - (ulong)(uVar16 % (ulong)(local_2d8 + 2) == 0);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x28a;
  macroName_89.m_size = 5;
  macroName_89.m_start = "CHECK";
  capturedExpression_89.m_size = 0x27;
  capturedExpression_89.m_start = "2 == subsection2.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_89,(SourceLineInfo *)local_290,
             capturedExpression_89,ContinueOnFailure);
  uVar16 = CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3;
  local_278[0]._8_8_ =
       (uVar16 / (ulong)(local_2d8 + 2) + 1) - (ulong)(uVar16 % (ulong)(local_2d8 + 2) == 0);
  local_288._1_1_ = local_278[0]._8_8_ == 2;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_288._4_4_ = 2;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x28b;
  macroName_90.m_size = 10;
  macroName_90.m_start = "CHECK_THAT";
  capturedExpression_90.m_size = 0x27;
  capturedExpression_90.m_start = "16., WithinRel( subsection2.F()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_90,(SourceLineInfo *)local_290,
             capturedExpression_90,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4030000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  uVar13 = 3;
  if (pcVar18 < (char *)0x3) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_290,*(double *)(local_2b8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x28c;
  macroName_91.m_size = 10;
  macroName_91.m_start = "CHECK_THAT";
  capturedExpression_91.m_size = 0x27;
  capturedExpression_91.m_start = "18., WithinRel( subsection2.F()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_91,(SourceLineInfo *)local_290,
             capturedExpression_91,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4032000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  pcVar19 = (char *)0x3;
  if (pcVar18 < (char *)0x3) {
    pcVar19 = pcVar18;
  }
  local_248 = (iterator_t<CRng> *)(local_2b8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(local_2b8._0_8_ + pcVar18 * 8);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_58 = local_258;
  local_60._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_58,&local_60,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_60._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x28d;
  macroName_92.m_size = 10;
  macroName_92.m_start = "CHECK_THAT";
  capturedExpression_92.m_size = 0x27;
  capturedExpression_92.m_start = "22., WithinRel( subsection2.F()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_92,(SourceLineInfo *)local_290,
             capturedExpression_92,ContinueOnFailure);
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_230._0_8_ = (_func_int **)0x4036000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 3;
  if (pcVar19 < (char *)0x3) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x28e;
  macroName_93.m_size = 10;
  macroName_93.m_start = "CHECK_THAT";
  capturedExpression_93.m_size = 0x27;
  capturedExpression_93.m_start = "24., WithinRel( subsection2.F()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_93,(SourceLineInfo *)local_290,
             capturedExpression_93,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4038000000000000;
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x3;
  if (pcVar19 < (char *)0x3) {
    pcVar18 = pcVar19;
  }
  local_248 = (iterator_t<CRng> *)(pdVar17 + ((ulong)pcVar18 & 0xffffffff));
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(pdVar17 + (long)pcVar19);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_48 = local_258;
  local_50._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_48,&local_50,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_50._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x28f;
  macroName_94.m_size = 10;
  macroName_94.m_start = "CHECK_THAT";
  capturedExpression_94.m_size = 0x33;
  capturedExpression_94.m_start = "16., WithinRel( subsection2.probabilities()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_94,(SourceLineInfo *)local_290,
             capturedExpression_94,ContinueOnFailure);
  local_230._0_8_ = (_func_int **)0x4030000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  uVar13 = 3;
  if (pcVar18 < (char *)0x3) {
    uVar13 = (uint)pcVar18;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_290,*(double *)(local_2b8._0_8_ + (ulong)uVar13 * 8));
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x290;
  macroName_95.m_size = 10;
  macroName_95.m_start = "CHECK_THAT";
  capturedExpression_95.m_size = 0x33;
  capturedExpression_95.m_start = "18., WithinRel( subsection2.probabilities()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_95,(SourceLineInfo *)local_290,
             capturedExpression_95,ContinueOnFailure);
  local_1b8._M_current = (double *)0x4032000000000000;
  pcVar18 = (char *)(CONCAT44(local_2b8._12_4_,local_2b8._8_4_) - local_2b8._0_8_ >> 3);
  if (local_2d8 + 2 < pcVar18) {
    pcVar18 = local_2d8 + 2;
  }
  pcVar19 = (char *)0x3;
  if (pcVar18 < (char *)0x3) {
    pcVar19 = pcVar18;
  }
  local_248 = (iterator_t<CRng> *)(local_2b8._0_8_ + ((ulong)pcVar19 & 0xffffffff) * 8);
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(local_2b8._0_8_ + pcVar18 * 8);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar18 - (long)pcVar19) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_38 = local_258;
  local_40._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_38,&local_40,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_40._M_current);
  pIVar11 = local_210;
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)&local_1b8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = &local_1b8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x291;
  macroName_96.m_size = 10;
  macroName_96.m_start = "CHECK_THAT";
  capturedExpression_96.m_size = 0x33;
  capturedExpression_96.m_start = "22., WithinRel( subsection2.probabilities()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_96,(SourceLineInfo *)local_290,
             capturedExpression_96,ContinueOnFailure);
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  local_230._0_8_ = (_func_int **)0x4036000000000000;
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  uVar13 = 3;
  if (pcVar19 < (char *)0x3) {
    uVar13 = (uint)pcVar19;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,pdVar17[uVar13]);
  bVar12 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_290,(double *)local_230);
  bStack_24f = bVar12;
  local_258[8] = true;
  local_258._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_248 = (iterator_t<CRng> *)local_230;
  local_240 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x292;
  macroName_97.m_size = 10;
  macroName_97.m_start = "CHECK_THAT";
  capturedExpression_97.m_size = 0x33;
  capturedExpression_97.m_start = "24., WithinRel( subsection2.probabilities()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_97,(SourceLineInfo *)local_290,
             capturedExpression_97,ContinueOnFailure);
  local_1a8 = 24.0;
  pcVar18 = local_2d8 + 2;
  pdVar10 = (double *)CONCAT44(local_2b8._12_4_,local_2b8._8_4_);
  pdVar17 = (double *)(local_2b8._0_8_ + (local_2d8 + 2) * 8);
  if ((char *)((long)pdVar10 - local_2b8._0_8_ >> 3) <= pcVar18) {
    pdVar17 = pdVar10;
  }
  pcVar19 = (char *)((long)pdVar10 - (long)pdVar17 >> 3);
  if (pcVar18 < pcVar19) {
    pcVar19 = pcVar18;
  }
  pcVar18 = (char *)0x3;
  if (pcVar19 < (char *)0x3) {
    pcVar18 = pcVar19;
  }
  local_248 = (iterator_t<CRng> *)(pdVar17 + ((ulong)pcVar18 & 0xffffffff));
  unique0x00004a80 = (vector<double,_std::allocator<double>_> *)(pdVar17 + (long)pcVar19);
  local_240 = (WithinRelMatcher *)0x2;
  lVar14 = ((long)pcVar19 - (long)pcVar18) % 2;
  local_238 = 2 - lVar14;
  if (lVar14 == 0) {
    local_238 = 0;
  }
  local_1b0 = local_258;
  local_1b8._M_current = (double *)local_248;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1b0,&local_1b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_290,*local_1b8._M_current);
  bVar12 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_290,&local_1a8);
  bStack_227 = bVar12;
  local_230[8] = true;
  local_230._0_8_ = &PTR_streamReconstructedExpression_001f43d0;
  local_220 = (iterator_t<CRng> *)&local_1a8;
  local_218 = (WithinRelMatcher *)local_290;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_230);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_230);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  local_290 = (undefined1  [8])0x1af5a4;
  local_288 = (pointer)0x294;
  macroName_98.m_size = 5;
  macroName_98.m_start = "CHECK";
  capturedExpression_98.m_size = 0xf;
  capturedExpression_98.m_start = "8 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,macroName_98,(SourceLineInfo *)local_290,
             capturedExpression_98,ContinueOnFailure);
  local_278[0]._8_8_ =
       njoy::ENDFtk::
       InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
       ::NC(pIVar11);
  local_288._1_1_ = local_278[0]._8_8_ == 8;
  local_288._0_1_ = true;
  local_290 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_288._4_4_ = 8;
  local_280 = (double *)0x1b2ad1;
  local_278[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_330,(ITransientExpression *)local_290);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_290);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  if (local_2f5 == false) {
    (*local_2f0->_vptr_IResultCapture[0x13])();
  }
  if ((double *)local_2b8._0_8_ != (double *)0x0) {
    operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
  }
  if ((double *)local_1d8._0_8_ != (double *)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
  }
  return;
}

Assistant:

void verifyChunkWithLANG14( const ContinuumEnergyAngle& chunk ) {

  CHECK( 1 == chunk.LAW() );
  CHECK( 2 == chunk.LEP() );
  CHECK( 2 == chunk.NE() );
  CHECK( 2 == chunk.numberIncidentEnergies() );
  CHECK( 1 == chunk.NR() );
  CHECK( 1 == chunk.numberInterpolationRegions() );
  CHECK( 1 == chunk.INT().size() );
  CHECK( 1 == chunk.NBT().size() );
  CHECK( 1 == chunk.INT()[0] );
  CHECK( 2 == chunk.NBT()[0] );
  CHECK( 1 == chunk.interpolants().size() );
  CHECK( 1 == chunk.boundaries().size() );
  CHECK( 1 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.boundaries()[0] );

  auto energies = chunk.distributions();

  auto subsection1 = std::get< TabulatedDistribution >( energies[0] );
  CHECK_THAT( 1e-5, WithinRel( subsection1.E() ) );
  CHECK_THAT( 1e-5, WithinRel( subsection1.incidentEnergy() ) );
  CHECK( 14 == subsection1.LANG() );
  CHECK( 14 == subsection1.representation() );
  CHECK( 0 == subsection1.ND() );
  CHECK( 0 == subsection1.numberDiscreteEnergies() );
  CHECK( 4 == subsection1.NA() );
  CHECK( 4 == subsection1.numberAngularParameters() );
  CHECK( 12 == subsection1.NW() );
  CHECK( 2 == subsection1.NEP() );
  CHECK( 2 == subsection1.numberSecondaryEnergies() );
  CHECK( 2 == subsection1.EP().size() );
  CHECK( 2 == subsection1.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection1.EP()[0] ) );
  CHECK_THAT( 7., WithinRel( subsection1.EP()[1] ) );
  CHECK_THAT( 1., WithinRel( subsection1.energies()[0] ) );
  CHECK_THAT( 7., WithinRel( subsection1.energies()[1] ) );
  CHECK( 2 == subsection1.F0().size() );
  CHECK( 2 == subsection1.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection1.F0()[0] ) );
  CHECK_THAT( 8., WithinRel( subsection1.F0()[1] ) );
  CHECK_THAT( 2., WithinRel( subsection1.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 8., WithinRel( subsection1.totalEmissionProbabilities()[1] ) );
  CHECK( 2 == subsection1.MU().size() );
  CHECK( 2 == subsection1.cosines().size() );
  CHECK_THAT( 3., WithinRel( subsection1.MU()[0][0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.MU()[0][1] ) );
  CHECK_THAT( 9., WithinRel( subsection1.MU()[1][0] ) );
  CHECK_THAT( 11., WithinRel( subsection1.MU()[1][1] ) );
  CHECK_THAT( 3., WithinRel( subsection1.cosines()[0][0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.cosines()[0][1] ) );
  CHECK_THAT( 9., WithinRel( subsection1.cosines()[1][0] ) );
  CHECK_THAT( 11., WithinRel( subsection1.cosines()[1][1] ) );
  CHECK( 2 == subsection1.F().size() );
  CHECK( 2 == subsection1.probabilities().size() );
  CHECK_THAT( 4., WithinRel( subsection1.F()[0][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.F()[0][1] ) );
  CHECK_THAT( 10., WithinRel( subsection1.F()[1][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.F()[1][1] ) );
  CHECK_THAT( 4., WithinRel( subsection1.probabilities()[0][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.probabilities()[0][1] ) );
  CHECK_THAT( 10., WithinRel( subsection1.probabilities()[1][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.probabilities()[1][1] ) );

  auto subsection2 = std::get< TabulatedDistribution >( energies[1] );
  CHECK_THAT( 2e+7, WithinRel( subsection2.E() ) );
  CHECK_THAT( 2e+7, WithinRel( subsection2.incidentEnergy() ) );
  CHECK( 14 == subsection2.LANG() );
  CHECK( 0 == subsection2.ND() );
  CHECK( 0 == subsection2.numberDiscreteEnergies() );
  CHECK( 4 == subsection2.NA() );
  CHECK( 4 == subsection2.numberAngularParameters() );
  CHECK( 12 == subsection2.NW() );
  CHECK( 2 == subsection2.NEP() );
  CHECK( 2 == subsection2.numberSecondaryEnergies() );
  CHECK( 2 == subsection2.EP().size() );
  CHECK( 2 == subsection2.energies().size() );
  CHECK_THAT( 13., WithinRel( subsection2.EP()[0] ) );
  CHECK_THAT( 19., WithinRel( subsection2.EP()[1] ) );
  CHECK_THAT( 13., WithinRel( subsection2.energies()[0] ) );
  CHECK_THAT( 19., WithinRel( subsection2.energies()[1] ) );
  CHECK( 2 == subsection2.F0().size() );
  CHECK( 2 == subsection2.totalEmissionProbabilities().size() );
  CHECK_THAT( 14., WithinRel( subsection2.F0()[0] ) );
  CHECK_THAT( 20., WithinRel( subsection2.F0()[1] ) );
  CHECK_THAT( 14., WithinRel( subsection2.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 20., WithinRel( subsection2.totalEmissionProbabilities()[1] ) );
  CHECK( 2 == subsection2.MU().size() );
  CHECK( 2 == subsection2.cosines().size() );
  CHECK_THAT( 15., WithinRel( subsection2.MU()[0][0] ) );
  CHECK_THAT( 17., WithinRel( subsection2.MU()[0][1] ) );
  CHECK_THAT( 21., WithinRel( subsection2.MU()[1][0] ) );
  CHECK_THAT( 23., WithinRel( subsection2.MU()[1][1] ) );
  CHECK_THAT( 15., WithinRel( subsection2.cosines()[0][0] ) );
  CHECK_THAT( 17., WithinRel( subsection2.cosines()[0][1] ) );
  CHECK_THAT( 21., WithinRel( subsection2.cosines()[1][0] ) );
  CHECK_THAT( 23., WithinRel( subsection2.cosines()[1][1] ) );
  CHECK( 2 == subsection2.F().size() );
  CHECK( 2 == subsection2.probabilities().size() );
  CHECK_THAT( 16., WithinRel( subsection2.F()[0][0] ) );
  CHECK_THAT( 18., WithinRel( subsection2.F()[0][1] ) );
  CHECK_THAT( 22., WithinRel( subsection2.F()[1][0] ) );
  CHECK_THAT( 24., WithinRel( subsection2.F()[1][1] ) );
  CHECK_THAT( 16., WithinRel( subsection2.probabilities()[0][0] ) );
  CHECK_THAT( 18., WithinRel( subsection2.probabilities()[0][1] ) );
  CHECK_THAT( 22., WithinRel( subsection2.probabilities()[1][0] ) );
  CHECK_THAT( 24., WithinRel( subsection2.probabilities()[1][1] ) );

  CHECK( 8 == chunk.NC() );
}